

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode do_init_writer_stack(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cwriter *pCStack_20;
  CURLcode result;
  Curl_cwriter *writer;
  Curl_easy *data_local;
  
  writer = (Curl_cwriter *)data;
  data_local._4_4_ =
       Curl_cwriter_create(&(data->req).writer_stack,data,&Curl_cwt_out,CURL_CW_CLIENT);
  if ((data_local._4_4_ == CURLE_OK) &&
     (data_local._4_4_ =
           Curl_cwriter_create(&stack0xffffffffffffffe0,(Curl_easy *)writer,&cw_download,
                               CURL_CW_PROTOCOL), data_local._4_4_ == CURLE_OK)) {
    CVar1 = Curl_cwriter_add((Curl_easy *)writer,pCStack_20);
    if (CVar1 != CURLE_OK) {
      Curl_cwriter_free((Curl_easy *)writer,pCStack_20);
    }
    data_local._4_4_ =
         Curl_cwriter_create(&stack0xffffffffffffffe0,(Curl_easy *)writer,&cw_raw,CURL_CW_RAW);
    if ((data_local._4_4_ == CURLE_OK) &&
       (data_local._4_4_ = Curl_cwriter_add((Curl_easy *)writer,pCStack_20),
       data_local._4_4_ != CURLE_OK)) {
      Curl_cwriter_free((Curl_easy *)writer,pCStack_20);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode do_init_writer_stack(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  DEBUGASSERT(!data->req.writer_stack);
  result = Curl_cwriter_create(&data->req.writer_stack,
                               data, &Curl_cwt_out, CURL_CW_CLIENT);
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_download, CURL_CW_PROTOCOL);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }

  result = Curl_cwriter_create(&writer, data, &cw_raw, CURL_CW_RAW);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }
  return result;
}